

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::GetSub
          (TPZMatrix<Fad<double>_> *this,TPZVec<long> *indices,TPZFMatrix<Fad<double>_> *block)

{
  int64_t iVar1;
  long *plVar2;
  Fad<double> *this_00;
  TPZVec<long> *in_RSI;
  long *in_RDI;
  int64_t jel;
  int64_t iel;
  int64_t nel;
  Fad<double> *pFVar3;
  int64_t in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffffb0;
  long local_30;
  long local_28;
  
  iVar1 = TPZVec<long>::NElements(in_RSI);
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[](in_RSI,local_28);
      pFVar3 = (Fad<double> *)*plVar2;
      plVar2 = TPZVec<long>::operator[](in_RSI,local_30);
      (**(code **)(*in_RDI + 0x120))(&stack0xffffffffffffffb0,in_RDI,pFVar3,*plVar2);
      this_00 = TPZFMatrix<Fad<double>_>::operator()
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa0);
      Fad<double>::operator=(this_00,pFVar3);
      Fad<double>::~Fad(this_00);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}